

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry * NscBuildStruct(CNscPStackEntry *pId,CNscPStackEntry *pList)

{
  CNscContext *this;
  bool bVar1;
  NscType NVar2;
  NscSymbol *nStructDataSize;
  char *pcVar3;
  CNscPStackEntry *in_RSI;
  CNscPStackEntry *in_RDI;
  CNscContext *unaff_retaddr;
  bool fProblem;
  NscSymbol *pSymbol;
  CNscPStackEntry *in_stack_ffffffffffffffa8;
  CNscContext *in_stack_ffffffffffffffb0;
  
  if (in_RDI == (CNscPStackEntry *)0x0) {
    __assert_fail("pId",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                  ,0x9c9,"CNscPStackEntry *NscBuildStruct(CNscPStackEntry *, CNscPStackEntry *)");
  }
  if (in_RSI != (CNscPStackEntry *)0x0) {
    NVar2 = CNscPStackEntry::GetType(in_RSI);
    if (((NVar2 != NscType_Error) &&
        (NVar2 = CNscPStackEntry::GetType(in_RDI), NVar2 != NscType_Error)) &&
       (bVar1 = CNscContext::IsPhase2(g_pCtx), !bVar1)) {
      CNscPStackEntry::GetIdentifier(in_RDI);
      nStructDataSize =
           CNscContext::FindStructTagSymbol
                     (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
      this = g_pCtx;
      bVar1 = false;
      if (nStructDataSize != (NscSymbol *)0x0) {
        if (nStructDataSize->nSymType == NscSymType_Structure) {
          pcVar3 = CNscPStackEntry::GetIdentifier(in_RDI);
          CNscContext::GenerateMessage
                    (this,NscMessage_ErrorStructureRedefined,pcVar3,nStructDataSize);
        }
        else {
          pcVar3 = CNscPStackEntry::GetIdentifier(in_RDI);
          CNscContext::GenerateMessage
                    (this,NscMessage_ErrorStructSymbolTypeMismatch,pcVar3,nStructDataSize);
        }
        bVar1 = true;
      }
      if (!bVar1) {
        in_stack_ffffffffffffffb0 = g_pCtx;
        CNscPStackEntry::GetIdentifier(in_RDI);
        CNscPStackEntry::GetData(in_RSI);
        CNscPStackEntry::GetDataSize(in_RSI);
        CNscContext::AddStructure
                  (unaff_retaddr,(char *)in_RDI,(uchar *)in_RSI,(size_t)nStructDataSize);
      }
    }
    CNscContext::FreePStackEntry(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    CNscContext::FreePStackEntry(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    return (CNscPStackEntry *)0x0;
  }
  __assert_fail("pList",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                ,0x9ca,"CNscPStackEntry *NscBuildStruct(CNscPStackEntry *, CNscPStackEntry *)");
}

Assistant:

YYSTYPE NscBuildStruct (YYSTYPE pId, YYSTYPE pList)
{
	assert (pId);
	assert (pList);

	//
	// Check for silent errors
	//

	if (pList ->GetType () == NscType_Error ||
		pId ->GetType () == NscType_Error)
	{
	}

	//
	// Add the structure
	//

	else
	{
		if (!g_pCtx ->IsPhase2 ())
		{
			NscSymbol *pSymbol;
			bool fProblem;

			pSymbol = g_pCtx ->FindStructTagSymbol (pId ->GetIdentifier ());
			fProblem = false;

			//
			// Check that the symbol is not already defined.  Note that the
			// standard compiler silently allows this in some cases but does
			// not function correctly.  It's best to just flag this as a hard
			// error as the standard scripts do not have the problem.
			//

			if (pSymbol != NULL)
			{
				if (pSymbol ->nSymType == NscSymType_Structure)
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorStructureRedefined,
						pId ->GetIdentifier (), pSymbol);
					fProblem = true;
				}
				else
				{
					g_pCtx ->GenerateMessage (
						NscMessage_ErrorStructSymbolTypeMismatch,
						pId ->GetIdentifier (), pSymbol);
					fProblem = true;
				}
			}

			if (!fProblem)
			{
				g_pCtx ->AddStructure (pId ->GetIdentifier (),
					pList ->GetData (), pList ->GetDataSize ());
			}
		}
	}

	//
	// Rundown
	//

    g_pCtx ->FreePStackEntry (pId);
    g_pCtx ->FreePStackEntry (pList);
	return NULL;
}